

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.h
# Opt level: O0

void arangodb::velocypack::Collection::keys
               (Slice slice,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result)

{
  bool bVar1;
  char **__args;
  unsigned_long *in_RSI;
  ObjectIterator *in_RDI;
  string_view sv;
  ObjectIterator it;
  undefined8 in_stack_ffffffffffffff90;
  unsigned_long *__args_1;
  ObjectIterator *in_stack_ffffffffffffff98;
  Slice in_stack_ffffffffffffffa0;
  undefined1 translate;
  Slice in_stack_ffffffffffffffa8;
  char *local_50;
  char *__n;
  ObjectIterator local_38;
  unsigned_long *local_18;
  ValueLength local_8;
  
  local_18 = in_RSI;
  __n = local_50;
  ObjectIterator::ObjectIterator
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
             SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0));
  local_8 = ObjectIterator::size(&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDI,(size_type)__n);
  __args_1 = local_18;
  while( true ) {
    translate = (undefined1)((ulong)in_stack_ffffffffffffffa0._start >> 0x38);
    bVar1 = ObjectIterator::valid(&local_38);
    if (!bVar1) break;
    in_stack_ffffffffffffffa8 =
         ObjectIterator::key(in_stack_ffffffffffffffa8._start,(bool)translate);
    SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               in_stack_ffffffffffffffa8._start);
    in_stack_ffffffffffffffa0._start =
         (uint8_t *)
         std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)&local_50);
    __args = (char **)std::basic_string_view<char,_std::char_traits<char>_>::size
                                ((basic_string_view<char,_std::char_traits<char>_> *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*,unsigned_long>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffffa0._start,__args,__args_1);
    ObjectIterator::next(in_RDI);
  }
  return;
}

Assistant:

static void keys(Slice slice, std::vector<std::string>& result) {
    // pre-allocate result vector
    ObjectIterator it(slice, /*useSequentialIteration*/ false);
    result.reserve(checkOverflow(it.size()));

    while (it.valid()) {
      std::string_view sv = it.key(true).stringView();
      result.emplace_back(sv.data(), sv.size());
      it.next();
    }
  }